

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# final_contours_extract_features.cpp
# Opt level: O2

void thresh_callback(int param_1,void *param_2)

{
  undefined8 uVar1;
  pointer pMVar2;
  int iVar3;
  ostream *poVar4;
  _InputArray *p_Var5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  Point_<float> PVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  allocator<char> local_569;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  uint local_544;
  char str2 [5];
  char str1 [7];
  Scalar color;
  _Vector_base<int,_std::allocator<int>_> local_508;
  int local_4f0;
  int local_4ec;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> boundRect;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours_poly;
  undefined8 local_4a0;
  vector<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_> hierarchy;
  vector<float,_std::allocator<float>_> radius;
  Mat drawing;
  undefined1 local_408 [16];
  Size local_3f8;
  vector<cv::Mat,_std::allocator<cv::Mat>_> contourRegion;
  vector<cv::Moments,_std::allocator<cv::Moments>_> mu;
  vector<cv::Mat,_std::allocator<cv::Mat>_> images;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> center_contours;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> center;
  Mat overlap;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  Mat area;
  Mat cropped;
  Mat area1;
  Mat threshold_output;
  
  cv::Mat::Mat(&threshold_output);
  contours.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  contours.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  contours.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  hierarchy.super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  hierarchy.super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  hierarchy.super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  contourRegion.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  contourRegion.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  contourRegion.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3f8.width = 0;
  local_3f8.height = 0;
  local_408._0_4_ = 0x1010000;
  local_408._8_8_ = &src_gray;
  area._8_8_ = &drawing;
  drawing.flags = 0;
  drawing.dims = 0x40240000;
  area.flags = -0x3efdfffa;
  area.data = (uchar *)0x100000001;
  overlap.flags = 0;
  overlap.dims = 0x40590000;
  cropped.flags = -0x3efdfffa;
  area1.data = (uchar *)0x0;
  cropped._8_8_ = &overlap;
  cropped.data = (uchar *)0x100000001;
  area1.flags = 0x2010000;
  area1._8_8_ = &threshold_output;
  cv::inRange((_InputArray *)local_408,(_InputArray *)&area,(_InputArray *)&cropped,
              (_OutputArray *)&area1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_408,"thresh",(allocator<char> *)&cropped);
  area.data = (uchar *)0x0;
  area.flags = 0x1010000;
  area._8_8_ = &threshold_output;
  cv::imshow((string *)local_408,(_InputArray *)&area);
  std::__cxx11::string::~string((string *)local_408);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_408,"middle.jpg",(allocator<char> *)&area1);
  area.data = (uchar *)0x0;
  area.flags = 0x1010000;
  cropped.flags = 0;
  cropped.dims = 0;
  cropped.rows = 0;
  cropped.cols = 0;
  cropped.data = (uchar *)0x0;
  area._8_8_ = &threshold_output;
  cv::imwrite((string *)local_408,(_InputArray *)&area,(vector *)&cropped);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&cropped);
  std::__cxx11::string::~string((string *)local_408);
  local_3f8.width = 0;
  local_3f8.height = 0;
  local_408._0_4_ = 0x1010000;
  area.data = (uchar *)0x0;
  area.flags = -0x7dfbfff4;
  area._8_8_ = &contours;
  cropped.data = (uchar *)0x0;
  cropped.flags = -0x7dfcffe4;
  cropped._8_8_ = &hierarchy;
  local_1c0 = 0;
  local_408._8_8_ = &threshold_output;
  cv::findContours(local_408,&area,&cropped,3,2);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::vector(&contours_poly,
           ((long)contours.
                  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)contours.
                 super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)local_408);
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
            (&boundRect,
             ((long)contours.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)contours.
                   super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)local_408);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            (&center,((long)contours.
                            super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)contours.
                           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18,
             (allocator_type *)local_408);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            (&center_contours,
             ((long)contours.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)contours.
                   super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)local_408);
  std::vector<float,_std::allocator<float>_>::vector
            (&radius,((long)contours.
                            super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)contours.
                           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18,
             (allocator_type *)local_408);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
            (&images,((long)contours.
                            super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)contours.
                           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18,
             (allocator_type *)local_408);
  std::vector<cv::Moments,_std::allocator<cv::Moments>_>::vector
            (&mu,((long)contours.
                        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)contours.
                       super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)local_408
            );
  cv::Mat::zeros((int)local_408,
                 (int)(((long)contours.
                              super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)contours.
                             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18),2);
  cv::MatExpr::operator_cast_to_Mat(&area,(MatExpr *)local_408);
  cv::MatExpr::~MatExpr((MatExpr *)local_408);
  cv::Mat::Mat(&cropped);
  cv::Mat::zeros((int)local_408,
                 (int)(((long)contours.
                              super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)contours.
                             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18),2);
  cv::MatExpr::operator_cast_to_Mat(&area1,(MatExpr *)local_408);
  cv::MatExpr::~MatExpr((MatExpr *)local_408);
  if ((thresh_callback(int,void*)::oss_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&thresh_callback(int,void*)::oss_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&thresh_callback(int,void*)::oss_abi_cxx11_);
    __cxa_atexit(std::__cxx11::stringstream::~stringstream,
                 &thresh_callback(int,void*)::oss_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&thresh_callback(int,void*)::oss_abi_cxx11_);
  }
  builtin_strncpy(str1,"result",7);
  builtin_strncpy(str2,".jpg",5);
  uVar8 = 0;
  while( true ) {
    if ((ulong)(((long)contours.
                       super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)contours.
                      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar8) break;
    cv::Mat::Mat<cv::Point_<int>>
              ((Mat *)local_408,
               contours.
               super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar8,false);
    drawing.data = (uchar *)0x0;
    drawing.flags = 0x1010000;
    overlap.data = (uchar *)0x0;
    overlap._8_8_ =
         contours_poly.
         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start + uVar8;
    overlap.flags = -0x7dfcfff4;
    drawing._8_8_ = (Mat *)local_408;
    cv::approxPolyDP((_InputArray *)&drawing,(_OutputArray *)&overlap,3.0,true);
    cv::Mat::~Mat((Mat *)local_408);
    cv::Mat::Mat<cv::Point_<int>>
              ((Mat *)local_408,
               contours_poly.
               super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar8,false);
    drawing.data = (uchar *)0x0;
    drawing.flags = 0x1010000;
    drawing._8_8_ = (Mat *)local_408;
    cv::boundingRect((_InputArray *)&overlap);
    boundRect.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start[uVar8].x = overlap.flags;
    boundRect.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start[uVar8].y = overlap.dims;
    boundRect.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start[uVar8].width = overlap.rows;
    boundRect.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start[uVar8].height = overlap.cols;
    cv::Mat::~Mat((Mat *)local_408);
    lVar6 = *area.step.p * (long)(int)uVar8;
    *(float *)(area.data + lVar6) = (float)uVar8;
    *(float *)(area.data + lVar6 + 4) =
         (float)boundRect.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar8].height *
         (float)boundRect.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar8].width;
    local_408._8_8_ =
         contours_poly.
         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start + uVar8;
    local_3f8.width = 0;
    local_3f8.height = 0;
    local_408._0_4_ = -0x7efcfff4;
    cv::minEnclosingCircle
              ((_InputArray *)local_408,
               (Point_ *)
               (center.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start + uVar8),
               radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + uVar8);
    lVar6 = (long)(int)uVar8 * *area1.step.p;
    *(float *)(area1.data + lVar6) = (float)uVar8;
    *(float *)(area1.data + lVar6 + 4) =
         radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar8] *
         radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar8];
    drawing.data = (uchar *)0x0;
    drawing._8_8_ =
         contours_poly.
         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start + uVar8;
    drawing.flags = -0x7efcfff4;
    cv::moments((_InputArray *)local_408,SUB81(&drawing,0));
    pMVar2 = mu.super__Vector_base<cv::Moments,_std::allocator<cv::Moments>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = uVar8 * 0xc0;
    memcpy(mu.super__Vector_base<cv::Moments,_std::allocator<cv::Moments>_>._M_impl.
           super__Vector_impl_data._M_start + lVar6,(Mat *)local_408,0xc0);
    uVar1 = *(undefined8 *)(pMVar2 + lVar6);
    auVar15._8_8_ = uVar1;
    auVar15._0_8_ = uVar1;
    auVar15 = divpd(*(undefined1 (*) [16])(pMVar2 + lVar6 + 8),auVar15);
    PVar11.x = (float)auVar15._0_8_;
    PVar11.y = (float)auVar15._8_8_;
    center_contours.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar8] = PVar11;
    uVar8 = uVar8 + 1;
  }
  local_1c8 = CONCAT44((int)*(undefined8 *)threshold_output.size.p,
                       (int)((ulong)*(undefined8 *)threshold_output.size.p >> 0x20));
  cv::Mat::zeros(local_408,&local_1c8,0x10);
  cv::MatExpr::operator_cast_to_Mat(&drawing,(MatExpr *)local_408);
  cv::MatExpr::~MatExpr((MatExpr *)local_408);
  local_1d0 = CONCAT44((int)*(undefined8 *)threshold_output.size.p,
                       (int)((ulong)*(undefined8 *)threshold_output.size.p >> 0x20));
  cv::Mat::zeros(local_408,&local_1d0,0x10);
  cv::MatExpr::operator_cast_to_Mat(&overlap,(MatExpr *)local_408);
  cv::MatExpr::~MatExpr((MatExpr *)local_408);
  lVar10 = 0;
  lVar9 = 0;
  lVar6 = 0;
  local_544 = 0;
  uVar8 = 0;
  while( true ) {
    if ((ulong)(((long)contours.
                       super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)contours.
                      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar8) break;
    uVar7 = (rng.state >> 0x20) + (rng.state & 0xffffffff) * 0xf83f630a;
    dVar12 = (double)(int)((uVar7 & 0xffffffff) % 0xff);
    uVar7 = (uVar7 >> 0x20) + (uVar7 & 0xffffffff) * 0xf83f630a;
    rng.state = (uVar7 >> 0x20) + (uVar7 & 0xffffffff) * 0xf83f630a;
    dVar13 = (double)(int)((uVar7 & 0xffffffff) % 0xff);
    dVar14 = (double)(int)((rng.state & 0xffffffff) % 0xff);
    cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&color);
    color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
    color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = dVar12;
    color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = dVar13;
    color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = dVar14;
    if (1500.0 < *(float *)(area.data + (lVar6 >> 0x20) * *area.step.p + 4)) {
      local_3f8.width = 0;
      local_3f8.height = 0;
      local_408._0_4_ = 0x3010000;
      local_408._8_8_ = &drawing;
      uVar1 = *(undefined8 *)
               ((long)&(boundRect.
                        super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl
                        .super__Vector_impl_data._M_start)->x + lVar10);
      local_4f0 = (int)uVar1;
      local_4ec = (int)((ulong)uVar1 >> 0x20);
      uVar1 = *(undefined8 *)
               ((long)&(boundRect.
                        super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl
                        .super__Vector_impl_data._M_start)->width + lVar10);
      local_4a0 = CONCAT44((int)((ulong)uVar1 >> 0x20) + local_4ec,(int)uVar1 + local_4f0);
      cv::rectangle((Mat *)local_408,&local_4f0,&local_4a0,&color,2,8,0);
      cv::Mat::Mat((Mat *)local_408,&src,
                   (Rect_ *)((long)&(boundRect.
                                     super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->x + lVar10));
      cv::Mat::operator=((Mat *)((long)&((Mat *)(&((Mat *)(&((Mat *)(&(images.
                                                  super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->step +
                                                  -3))->step + -3))->step + -3))->step +
                                lVar9 + 0xffffffffffffffb8U),(Mat *)local_408);
      cv::Mat::~Mat((Mat *)local_408);
      poVar4 = std::operator<<((ostream *)&DAT_0010a330,str1);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4,str2);
      std::__cxx11::stringbuf::str();
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_408);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)local_408);
      std::ios::clear((int)*(undefined8 *)(thresh_callback(int,void*)::oss_abi_cxx11_ + -0x18) +
                      0x10a320);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_408,"",(allocator<char> *)&local_508);
      std::__cxx11::stringbuf::str((string *)&DAT_0010a338);
      local_544 = local_544 + 1;
      std::__cxx11::string::~string((string *)local_408);
    }
    uVar8 = uVar8 + 1;
    lVar6 = lVar6 + 0x100000000;
    lVar9 = lVar9 + 0x60;
    lVar10 = lVar10 + 0x10;
  }
  printf("count %d\n",(ulong)local_544);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_408,"Contours",(allocator<char> *)&color);
  cv::namedWindow((string *)local_408,1);
  std::__cxx11::string::~string((string *)local_408);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_408,"contours_.jpg",&local_569)
  ;
  color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
       (double)CONCAT44(color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._4_4_,0x1010000);
  local_508._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_508._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_508._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)&drawing;
  cv::imwrite((string *)local_408,(_InputArray *)&color,(vector *)&local_508);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_508);
  std::__cxx11::string::~string((string *)local_408);
  local_3f8.width = 0;
  local_3f8.height = 0;
  local_408._0_4_ = 0x1010000;
  color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  local_408._8_8_ = &src;
  local_508._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
       (double)CONCAT44(color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._4_4_,0x1010000);
  local_508._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x2010000;
  local_508._M_impl.super__Vector_impl_data._M_finish = &overlap.flags;
  color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)&drawing;
  p_Var5 = (_InputArray *)cv::noArray();
  cv::add((_InputArray *)local_408,(_InputArray *)&color,(_OutputArray *)&local_508,p_Var5,-1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_408,"Contours",(allocator<char> *)&local_508);
  color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
       (double)CONCAT44(color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._4_4_,0x1010000);
  color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)&overlap;
  cv::imshow((string *)local_408,(_InputArray *)&color);
  std::__cxx11::string::~string((string *)local_408);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_408,"overlap.jpg",&local_569);
  color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
       (double)CONCAT44(color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._4_4_,0x1010000);
  local_508._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_508._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_508._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)&overlap;
  cv::imwrite((string *)local_408,(_InputArray *)&color,(vector *)&local_508);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_508);
  std::__cxx11::string::~string((string *)local_408);
  cv::Mat::~Mat(&overlap);
  cv::Mat::~Mat(&drawing);
  cv::Mat::~Mat(&area1);
  cv::Mat::~Mat(&cropped);
  cv::Mat::~Mat(&area);
  std::_Vector_base<cv::Moments,_std::allocator<cv::Moments>_>::~_Vector_base
            (&mu.super__Vector_base<cv::Moments,_std::allocator<cv::Moments>_>);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&images);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&radius.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
            (&center_contours.
              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
  std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
            (&center.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
  std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base
            (&boundRect.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&contours_poly);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&contourRegion);
  std::_Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>::~_Vector_base
            (&hierarchy.super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&contours);
  cv::Mat::~Mat(&threshold_output);
  return;
}

Assistant:

void thresh_callback(int, void* )
{
  Mat threshold_output;
  vector<vector<Point> > contours;
  vector<Vec4i> hierarchy;
  vector<Mat> contourRegion;
  float minArea= 1500.0;  // threshold for area-wise cleanup
  /// Detect edges using Threshold for user thresh i/p
// threshold( src_gray, threshold_output, thresh, 255, THRESH_BINARY );
	//adaptiveThreshold(src_gray, threshold_output, 255, ADAPTIVE_THRESH_GAUSSIAN_C, CV_THRESH_BINARY, 151, 0);
 // threshold( src_gray, threshold_output, 128, 255, THRESH_BINARY );
  inRange(src_gray, 10,100, threshold_output);
  imshow("thresh", threshold_output);
  imwrite("middle.jpg", threshold_output);
  //closing operation
//  dilate(threshold_output, threshold_output, cv::Mat(), cv::Point(-1,-1),3);
//  erode(threshold_output, threshold_output, cv::Mat(), cv::Point(-1,-1),3);
//  imshow("thresh_close", threshold_output);
  
  /// Find contours
  findContours( threshold_output, contours, hierarchy, RETR_TREE, CHAIN_APPROX_SIMPLE, Point(0, 0) );
  
  //variables for drawing and extraction
  vector<vector<Point> > contours_poly( contours.size() );
  vector<Rect> boundRect( contours.size() );
  vector<Point2f>center( contours.size() );	 // centers of the enclosing circles
  vector<Point2f>center_contours( contours.size() );	 // centers of the contours
  vector<float>radius( contours.size() );  //radii of the enclosing circles
  vector<Mat>images(contours.size()); // extracted images from bounding rectangles
  vector<Moments>mu(contours.size()); // moments of the contours
 
  Mat area = Mat::zeros(contours.size(), 2, CV_32F);
  Mat cropped;
  Mat area1 = Mat::zeros(contours.size(), 2, CV_32F);
  static std:: stringstream oss;
  int count_contours =0;  // contours with area greater than minArea 
  char destname[30]= "";
  const char  str1[7] = "result";
  const char str2[5] = ".jpg";
  
  /// Approximate contours to polygons + get bounding rects and circles
  for( size_t i = 0; i < contours.size(); i++ )
     { 
		approxPolyDP( Mat(contours[i]), contours_poly[i], 3, true );
        boundRect[i] = boundingRect( Mat(contours_poly[i]) );
	    // area of rectangles
	     area.at<float>(i,0)=(float)i;
		 area.at<float>(i,1)= (float)boundRect[i].width* boundRect[i].height;
		
         minEnclosingCircle( contours_poly[i], center[i], radius[i] );
		// area of circles
	     area1.at<float>(i,0)=(float)i;
		 area1.at<float>(i,1)= (float)(radius[i]*radius[i]);

		//moments of the contour
		mu[i]= moments(contours_poly[i], false);
		
		//center of the contour
		center_contours[i]= Point2f( mu[i].m10/mu[i].m00 , mu[i].m01/mu[i].m00 );
     }


  /// Draw polygonal contour + bonding rects + circles
	  Mat drawing = Mat::zeros( threshold_output.size(), CV_8UC3 );
	  Mat overlap = Mat::zeros( threshold_output.size(), CV_8UC3 );
  for( size_t i = 0; i< contours.size(); i++ )
     {
       Scalar color = Scalar( rng.uniform(0, 255), rng.uniform(0,255), rng.uniform(0,255) );
       //drawContours( drawing, contours_poly, (int)i, color, 1, 8, vector<Vec4i>(), 0, Point() );
//  try if something else can be used for comparison  e.g contourArea/RectArea
       if(area.at<float>(i,1)> minArea)
		{	
			 //draw the rectangle
			  rectangle( drawing, boundRect[i].tl(), boundRect[i].br(), color, 2, 8, 0 );
			 //calculate moments for the contour
			 // draw the enclosing circle
             // circle( drawing, center[i], (int)radius[i], color, 2, 8, 0 );
			 
			 //mark the center of the contour
			 //circle(drawing,center_contours[i],3, Scalar(255,0,0), -1,8,0 );
			  
			  images[i]= src(boundRect[i]);
			  count_contours +=1;
			  //mark the center of the enclosing circle
			  //circle( drawing, center[i], 3, Scalar(0,255,0), -1, 8, 0 );

			//  strcpy(destname, str1); itoa((int)i, destname, 10);
			//	strcat(destname, str2);
			oss<< str1 << i<< str2;
	        cout << oss.str() << endl;
				 
			 // imshow(oss.str(), images[i]);
			  oss.clear();
			  oss.str(""); 
		}
	
			   
     }
/*	for(size_t i=0;i <contours.size();i++)
	{		
			Mat mask = Mat::zeros(src.size(), CV_8UC1);
			drawContours(mask, contours, (int)i, Scalar(255), CV_FILLED);		
			Mat imageROI;
			src.copyTo(imageROI, mask);
			contourRegion[i]= imageROI(boundRect[i]);
	}*/
		
//printing areas of rectangles
/*	for(size_t i=0;i<contours.size(); i++)
	{
			cout<< " " << area.at<float>(i,0) <<  " " << area.at<float>(i,1) << endl;
	}

//	qsort(area.data, area.rows, sizeof(area.row(0)), compareforsort);
	
	for(size_t i=0;i<contours.size(); i++)
	{
			cout<< " " << area.at<float>(i,0) <<  " " << area.at<float>(i,1) << endl;
	}*/
	printf("count %d\n", count_contours);
  /// Show in a window
  namedWindow( "Contours" );
  //imshow( "Contours", drawing );
	imwrite("contours_.jpg", drawing);
	
	add(src, drawing, overlap);
	imshow("Contours", overlap);
	imwrite("overlap.jpg", overlap);
}